

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_InitHooks(cJSON_Hooks *hooks)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  
  if (hooks == (cJSON_Hooks *)0x0) {
    pcVar3 = realloc;
    pcVar2 = free;
    pcVar1 = malloc;
  }
  else {
    pcVar1 = hooks->malloc_fn;
    if (pcVar1 == (_func_void_ptr_size_t *)0x0) {
      pcVar1 = malloc;
    }
    pcVar2 = hooks->free_fn;
    if (pcVar2 == (_func_void_void_ptr *)0x0) {
      pcVar2 = free;
    }
    if (pcVar2 == free && pcVar1 == malloc) {
      pcVar3 = realloc;
    }
    else {
      pcVar3 = (_func_void_ptr_void_ptr_size_t *)0x0;
    }
  }
  global_hooks.allocate = pcVar1;
  global_hooks.deallocate = pcVar2;
  global_hooks.reallocate = pcVar3;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InitHooks(cJSON_Hooks* hooks)
{
    if (hooks == NULL)
    {
        /* Reset hooks */
        global_hooks.allocate = malloc;
        global_hooks.deallocate = free;
        global_hooks.reallocate = realloc;
        return;
    }

    global_hooks.allocate = malloc;
    if (hooks->malloc_fn != NULL)
    {
        global_hooks.allocate = hooks->malloc_fn;
    }

    global_hooks.deallocate = free;
    if (hooks->free_fn != NULL)
    {
        global_hooks.deallocate = hooks->free_fn;
    }

    /* use realloc only if both free and malloc are used */
    global_hooks.reallocate = NULL;
    if ((global_hooks.allocate == malloc) && (global_hooks.deallocate == free))
    {
        global_hooks.reallocate = realloc;
    }
}